

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetShadingRate
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,SHADING_RATE BaseRate,
          SHADING_RATE_COMBINER PrimitiveCombiner,SHADING_RATE_COMBINER TextureCombiner,int param_4)

{
  SHADING_RATE SVar1;
  COMMAND_QUEUE_TYPE CVar2;
  SHADING_RATE_CAP_FLAGS SVar3;
  ulong uVar4;
  long lVar5;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  COMMAND_QUEUE_TYPE Type;
  char (*in_R9) [8];
  RenderDeviceVkImpl *pRVar6;
  string msg;
  string local_68;
  String local_48;
  
  CVar2 = (this->m_Desc).QueueType;
  Type = PrimitiveCombiner;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_68,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x84e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_68,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x84e);
    Type = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      Type = extraout_DL_00;
    }
    CVar2 = (this->m_Desc).QueueType;
  }
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_48,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[15],char[22],std::__cxx11::string,char[8]>
              (&local_68,(Diligent *)"SetShadingRate",(char (*) [15])0x90701a,
               (char (*) [22])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x84e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((byte)(PrimitiveCombiner ^ PrimitiveCombiner - SHADING_RATE_COMBINER_PASSTHROUGH) <=
      (byte)(PrimitiveCombiner - SHADING_RATE_COMBINER_PASSTHROUGH)) {
    FormatString<char[46]>(&local_68,(char (*) [46])"Only one primitive combiner must be specified")
    ;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x850);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((byte)(TextureCombiner ^ TextureCombiner - SHADING_RATE_COMBINER_PASSTHROUGH) <=
      (byte)(TextureCombiner - SHADING_RATE_COMBINER_PASSTHROUGH)) {
    FormatString<char[44]>(&local_68,(char (*) [44])"Only one texture combiner must be specified");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x851);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar6 = (this->m_pDevice).m_pObject;
  if ((pRVar6->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
      VariableRateShading == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[76]>
              (&local_68,
               (char (*) [76])
               "IDeviceContext::SetShadingRate: VariableRateShading feature must be enabled");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x852);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pRVar6 = (this->m_pDevice).m_pObject;
  }
  SVar3 = (pRVar6->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.CapFlags;
  if ((SVar3 & (SHADING_RATE_CAP_FLAG_TEXTURE_BASED|SHADING_RATE_CAP_FLAG_PER_PRIMITIVE|
               SHADING_RATE_CAP_FLAG_PER_DRAW)) == SHADING_RATE_CAP_FLAG_NONE) {
    FormatString<char[184]>
              (&local_68,
               (char (*) [184])
               "IDeviceContext::SetShadingRate: requires one of the following capabilities: SHADING_RATE_CAP_FLAG_PER_DRAW, SHADING_RATE_CAP_FLAG_PER_PRIMITIVE, or SHADING_RATE_CAP_FLAG_TEXTURE_BASED"
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x857);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    SVar3 = (pRVar6->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.
            CapFlags;
  }
  if ((SVar3 & SHADING_RATE_CAP_FLAG_PER_PRIMITIVE) == SHADING_RATE_CAP_FLAG_NONE) {
    if (PrimitiveCombiner != SHADING_RATE_COMBINER_PASSTHROUGH) {
      FormatString<char[114]>
                (&local_68,
                 (char (*) [114])
                 "IDeviceContext::SetShadingRate: PrimitiveCombiner must be PASSTHROUGH when per primitive shading is not supported"
                );
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x85b);
LAB_002a6713:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (((pRVar6->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.
            Combiners & PrimitiveCombiner) == 0) {
    FormatString<char[89]>
              (&local_68,
               (char (*) [89])
               "IDeviceContext::SetShadingRate: PrimitiveCombiner must be one of the supported combiners"
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x859);
    goto LAB_002a6713;
  }
  if (((pRVar6->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.CapFlags &
      SHADING_RATE_CAP_FLAG_TEXTURE_BASED) == SHADING_RATE_CAP_FLAG_NONE) {
    if (TextureCombiner == SHADING_RATE_COMBINER_PASSTHROUGH) goto LAB_002a67c2;
    FormatString<char[112]>
              (&local_68,
               (char (*) [112])
               "IDeviceContext::SetShadingRate: TextureCombiner must be PASSTHROUGH when texture based shading is not supported"
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x860);
  }
  else {
    if (((pRVar6->
         super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
         ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.Combiners
        & TextureCombiner) != 0) goto LAB_002a67c2;
    FormatString<char[87]>
              (&local_68,
               (char (*) [87])
               "IDeviceContext::SetShadingRate: TextureCombiner must be one of the supported combiners"
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x85e);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_002a67c2:
  uVar4 = (ulong)(pRVar6->
                 super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                 ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.
                 NumShadingRates;
  if (uVar4 != 0) {
    lVar5 = 0xb0;
    do {
      SVar1 = (pRVar6->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.Description
              [lVar5 * 2 + -0x20];
      if (uVar4 <= lVar5 - 0xafU) break;
      lVar5 = lVar5 + 1;
    } while (SVar1 != BaseRate);
    if (SVar1 == BaseRate) {
      return;
    }
  }
  FormatString<char[84]>
            (&local_68,
             (char (*) [84])
             "IDeviceContext::SetShadingRate: BaseRate must be one of the supported shading rates");
  DebugAssertionFailed
            (local_68._M_dataplus._M_p,"SetShadingRate",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
             ,0x867);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::SetShadingRate(SHADING_RATE BaseRate, SHADING_RATE_COMBINER PrimitiveCombiner, SHADING_RATE_COMBINER TextureCombiner, int) const
{
#ifdef DILIGENT_DEVELOPMENT
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetShadingRate");

    DEV_CHECK_ERR(IsPowerOfTwo(PrimitiveCombiner), "Only one primitive combiner must be specified");
    DEV_CHECK_ERR(IsPowerOfTwo(TextureCombiner), "Only one texture combiner must be specified");
    DEV_CHECK_ERR(m_pDevice->GetDeviceInfo().Features.VariableRateShading, "IDeviceContext::SetShadingRate: VariableRateShading feature must be enabled");

    const ShadingRateProperties& SRProps = m_pDevice->GetAdapterInfo().ShadingRate;
    DEV_CHECK_ERR(SRProps.CapFlags & (SHADING_RATE_CAP_FLAG_PER_DRAW | SHADING_RATE_CAP_FLAG_PER_PRIMITIVE | SHADING_RATE_CAP_FLAG_TEXTURE_BASED),
                  "IDeviceContext::SetShadingRate: requires one of the following capabilities: SHADING_RATE_CAP_FLAG_PER_DRAW, "
                  "SHADING_RATE_CAP_FLAG_PER_PRIMITIVE, or SHADING_RATE_CAP_FLAG_TEXTURE_BASED");
    if (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_PER_PRIMITIVE)
        DEV_CHECK_ERR(SRProps.Combiners & PrimitiveCombiner, "IDeviceContext::SetShadingRate: PrimitiveCombiner must be one of the supported combiners");
    else
        DEV_CHECK_ERR(PrimitiveCombiner == SHADING_RATE_COMBINER_PASSTHROUGH, "IDeviceContext::SetShadingRate: PrimitiveCombiner must be PASSTHROUGH when per primitive shading is not supported");

    if (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
        DEV_CHECK_ERR(SRProps.Combiners & TextureCombiner, "IDeviceContext::SetShadingRate: TextureCombiner must be one of the supported combiners");
    else
        DEV_CHECK_ERR(TextureCombiner == SHADING_RATE_COMBINER_PASSTHROUGH, "IDeviceContext::SetShadingRate: TextureCombiner must be PASSTHROUGH when texture based shading is not supported");

    bool IsSupported = false;
    for (Uint32 i = 0; i < SRProps.NumShadingRates && !IsSupported; ++i)
    {
        IsSupported = (SRProps.ShadingRates[i].Rate == BaseRate);
    }
    DEV_CHECK_ERR(IsSupported, "IDeviceContext::SetShadingRate: BaseRate must be one of the supported shading rates");
#endif
}